

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void BaseSocket::SetTrafficDebugCallback
               (function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *fnCbTrafficDbg)

{
  function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> local_30;
  function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *local_10;
  function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)> *fnCbTrafficDbg_local;
  
  local_10 = fnCbTrafficDbg;
  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::function
            (&local_30,fnCbTrafficDbg);
  BaseSocketImpl::SetTrafficDebugCallback(&local_30);
  std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::~function(&local_30);
  return;
}

Assistant:

void BaseSocket::SetTrafficDebugCallback(std::function<void(const uint16_t, const char*, size_t, bool)> fnCbTrafficDbg)
{
    BaseSocketImpl::SetTrafficDebugCallback(fnCbTrafficDbg);
}